

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O2

Var Js::EngineInterfaceObject::Entry_LogDebugMessage
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptString *this;
  char16 *form;
  uint in_stack_00000010;
  Var in_stack_00000020;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0xeb,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a1e088;
    *puVar4 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0xeb,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a1e088;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0xeb,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00a1e088:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)callInfo & 0xfffffe) != 0) {
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if (bVar3) {
      this = VarTo<Js::JavascriptString>(in_stack_00000020);
      form = JavascriptString::GetString(this);
      Output::Print(form);
      Output::Flush();
    }
  }
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
}

Assistant:

Var EngineInterfaceObject::Entry_LogDebugMessage(RecyclableObject *function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if DBG
        if (callInfo.Count < 2 || !VarIs<JavascriptString>(args.Values[1]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptString* message = VarTo<JavascriptString>(args.Values[1]);

        Output::Print(message->GetString());
        Output::Flush();
#endif

        return scriptContext->GetLibrary()->GetUndefined();
    }